

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<HLSLVertexAttributeRemapNamed,_8UL>::push_back
          (SmallVector<HLSLVertexAttributeRemapNamed,_8UL> *this,HLSLVertexAttributeRemapNamed *t)

{
  HLSLVertexAttributeRemapNamed *t_local;
  SmallVector<HLSLVertexAttributeRemapNamed,_8UL> *this_local;
  
  reserve(this,(this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size + 1);
  HLSLVertexAttributeRemapNamed::HLSLVertexAttributeRemapNamed
            ((this->super_VectorView<HLSLVertexAttributeRemapNamed>).ptr +
             (this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size,t);
  (this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size =
       (this->super_VectorView<HLSLVertexAttributeRemapNamed>).buffer_size + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}